

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_6875f4::CodemodelConfig::DumpDirectories
          (Value *__return_storage_ptr__,CodemodelConfig *this)

{
  bool bVar1;
  Value local_68;
  reference local_40;
  Directory *d;
  iterator __end1;
  iterator __begin1;
  vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
  *__range1;
  CodemodelConfig *this_local;
  Value *directories;
  
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  __end1 = std::
           vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
           ::begin(&this->Directories);
  d = (Directory *)
      std::
      vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
      ::end(&this->Directories);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<(anonymous_namespace)::CodemodelConfig::Directory_*,_std::vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>_>
                                     *)&d), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<(anonymous_namespace)::CodemodelConfig::Directory_*,_std::vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>_>
               ::operator*(&__end1);
    DumpDirectory(&local_68,this,local_40);
    Json::Value::append(__return_storage_ptr__,&local_68);
    Json::Value::~Value(&local_68);
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::CodemodelConfig::Directory_*,_std::vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value CodemodelConfig::DumpDirectories()
{
  Json::Value directories = Json::arrayValue;
  for (Directory& d : this->Directories) {
    directories.append(this->DumpDirectory(d));
  }
  return directories;
}